

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HAPI.cpp
# Opt level: O0

void solve_fromArrays(int *probStatus,int *basisStatus,int XnumCol,int XnumRow,int XnumNz,
                     int XobjSense,int XobjOffset,double *XcolCost,double *XcolLower,
                     double *XcolUpper,double *XrowLower,double *XrowUpper,int *XAstart,int *XAindex
                     ,double *XAvalue,double *colPrimalValues,double *colDualValues,
                     double *rowPrimalValues,double *rowDualValues,int *basicVariables)

{
  reference pvVar1;
  reference __src;
  int *in_RSI;
  undefined4 *in_RDI;
  undefined4 in_R8D;
  HModel *in_stack_00000028;
  double *in_stack_00000030;
  int *in_stack_00000038;
  HModel *in_stack_00000040;
  char *in_stack_00000048;
  HModel *in_stack_00000050;
  void *in_stack_00000058;
  void *in_stack_00000060;
  void *in_stack_00000068;
  void *in_stack_00000070;
  vector<double,_std::allocator<double>_> XbasicVariables;
  vector<double,_std::allocator<double>_> XrowDualValues;
  vector<double,_std::allocator<double>_> XrowPrimalValues;
  vector<double,_std::allocator<double>_> XcolDualValues;
  vector<double,_std::allocator<double>_> XcolPrimalValues;
  HDual solver;
  int LcBasisStatus;
  HModel model;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffea214;
  int in_stack_fffffffffffea230;
  double *in_stack_fffffffffffea238;
  double *in_stack_fffffffffffea240;
  int in_stack_fffffffffffea248;
  int *in_stack_fffffffffffea250;
  size_type __n;
  int *in_stack_fffffffffffea258;
  double *in_stack_fffffffffffea260;
  HDual *in_stack_fffffffffffea270;
  HDual *this;
  vector<double,_std::allocator<double>_> vStack_15d58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffea2c0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffea2c8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffea2d0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffea2d8;
  HModel *in_stack_fffffffffffea2e0;
  vector<double,_std::allocator<double>_> avStack_15d10 [8];
  HModel *in_stack_fffffffffffea3c0;
  HModel *in_stack_fffffffffffea520;
  int in_stack_fffffffffffea5c0;
  int in_stack_fffffffffffea5c4;
  HModel *in_stack_fffffffffffea5c8;
  HDual *in_stack_fffffffffffea5d0;
  int local_bcc;
  int local_bc8;
  undefined4 local_bc0;
  vector<int,_std::allocator<int>_> local_a88 [109];
  undefined4 local_44;
  int *local_38;
  undefined4 *local_30;
  
  local_44 = in_R8D;
  local_38 = in_RSI;
  local_30 = in_RDI;
  HModel::HModel(in_stack_fffffffffffea3c0);
  HModel::load_fromArrays
            (in_stack_00000040,(int)((ulong)in_stack_00000038 >> 0x20),(int)in_stack_00000038,
             (double *)CONCAT44(in_stack_fffffffffffea214,local_44),in_stack_00000030,
             (double *)in_stack_00000028,in_stack_fffffffffffea230,in_stack_fffffffffffea238,
             in_stack_fffffffffffea240,in_stack_fffffffffffea248,in_stack_fffffffffffea250,
             in_stack_fffffffffffea258,in_stack_fffffffffffea260);
  HModel::scaleModel(in_stack_fffffffffffea520);
  uVar2 = local_44;
  if (*local_38 != 0) {
    HModel::replaceWithNewBasis(in_stack_00000040,in_stack_00000038);
    uVar2 = local_44;
  }
  HDual::HDual(in_stack_fffffffffffea270);
  HDual::solve(in_stack_fffffffffffea5d0,in_stack_fffffffffffea5c8,in_stack_fffffffffffea5c4,
               in_stack_fffffffffffea5c0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x144b0b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x144b1d);
  this = (HDual *)&stack0xfffffffffffea2c0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x144b2f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x144b44);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x144b51);
  HModel::util_getPrimalDualValues
            (in_stack_fffffffffffea2e0,in_stack_fffffffffffea2d8,in_stack_fffffffffffea2d0,
             in_stack_fffffffffffea2c8,in_stack_fffffffffffea2c0);
  __n = 0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](avStack_15d10,0);
  memcpy(in_stack_00000050,pvVar1,(long)local_bcc << 3);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&stack0xfffffffffffea2c0,__n);
  memcpy(in_stack_00000060,pvVar1,(long)local_bc8 << 3);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&stack0xfffffffffffea2d8,__n);
  memcpy(in_stack_00000058,pvVar1,(long)local_bcc << 3);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&vStack_15d58,__n);
  memcpy(in_stack_00000068,pvVar1,(long)local_bc8 << 3);
  __src = std::vector<int,_std::allocator<int>_>::operator[](local_a88,__n);
  memcpy(in_stack_00000070,__src,(long)local_bc8 << 2);
  HModel::util_reportSolverOutcome(in_stack_00000050,in_stack_00000048);
  HModel::util_reportModelDense((HModel *)this);
  *local_30 = local_bc0;
  *local_38 = 1;
  HModel::clearModel(in_stack_00000028);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffea214,uVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffea214,uVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffea214,uVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffea214,uVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffea214,uVar2));
  HDual::~HDual(this);
  HModel::~HModel((HModel *)CONCAT44(in_stack_fffffffffffea214,uVar2));
  return;
}

Assistant:

void solve_fromArrays(int* probStatus, int* basisStatus,
		      const int XnumCol, const int XnumRow, const int XnumNz, 
		      const int XobjSense, const int XobjOffset,
		      const double* XcolCost, const double* XcolLower, const double* XcolUpper,
		      const double* XrowLower, const double* XrowUpper,
		      const int* XAstart, const int* XAindex, const double* XAvalue,
		      double* colPrimalValues, double* colDualValues,
		      double* rowPrimalValues, double* rowDualValues,
		      int* basicVariables) {
  HModel model;
  model.load_fromArrays(XnumCol, XobjSense, XcolCost, XcolLower, XcolUpper,
			XnumRow, XrowLower, XrowUpper,
			XnumNz, XAstart, XAindex, XAvalue);
  model.scaleModel();

  int LcBasisStatus = (*basisStatus);
  //printf("solve_fromArrays: LcBasisStatus = %d\n", LcBasisStatus);fflush(stdout);
  if (LcBasisStatus) {
    //    printf("Basis status is %d\n", LcBasisStatus);
    model.replaceWithNewBasis(basicVariables);
    //    printf("Number of basic logicals is %d\n", model.numBasicLogicals);
  }

  HDual solver;
  solver.solve(&model);
  
  vector<double> XcolPrimalValues;
  vector<double> XcolDualValues;
  vector<double> XrowPrimalValues;
  vector<double> XrowDualValues;
  vector<double> XbasicVariables;
  
  model.util_getPrimalDualValues(XcolPrimalValues, XcolDualValues, XrowPrimalValues, XrowDualValues);

  memcpy(colPrimalValues, &(XcolPrimalValues[0]), sizeof(double)*model.numCol);
  memcpy(rowPrimalValues, &(XrowPrimalValues[0]), sizeof(double)*model.numRow);
  memcpy(colDualValues, &(XcolDualValues[0]), sizeof(double)*model.numCol);
  memcpy(rowDualValues, &(XrowDualValues[0]), sizeof(double)*model.numRow);
  memcpy(basicVariables, &(model.basicIndex[0]), sizeof(int)*model.numRow);
  LcBasisStatus = HiGHS_basisStatus_yes;
  model.util_reportSolverOutcome("Solve plain API");
#ifdef JAJH_dev
  model.util_reportModelDense();
#endif
  //  model.util_reportModel();
  //  model.util_reportModelSolution();

  //  printf("model.problemStatus = %d\n", model.problemStatus);
  (*probStatus) = model.problemStatus;
  (*basisStatus) = LcBasisStatus;
// Remove any current model
  model.clearModel();
  //  printf("solve_fromArrays: probStatus = %d\n", (*probStatus));
  return;
}